

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicAllTargetsLoadMS::Run(BasicAllTargetsLoadMS *this)

{
  CallLogWrapper *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  GLuint GVar4;
  GLint GVar5;
  ostream *poVar6;
  undefined7 extraout_var;
  size_t sVar7;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  byte bVar8;
  BasicAllTargetsLoadMS *pBVar9;
  int in_ESI;
  int iVar10;
  GLenum GVar11;
  vec4 *pvVar12;
  char *pcVar13;
  undefined4 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  GLuint GVar16;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_420;
  Vector<float,_4> local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3e0;
  size_type local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  undefined4 local_3bc;
  GLchar name [32];
  GLint uniforms;
  undefined8 local_388;
  char local_380;
  undefined1 uStack_37f;
  undefined6 uStack_37e;
  BasicAllTargetsLoadMS *local_370;
  GLuint textures [2];
  undefined1 local_358;
  undefined1 uStack_357;
  undefined6 uStack_356;
  GLuint fbo;
  undefined8 local_340;
  char local_338;
  undefined1 uStack_337;
  undefined6 uStack_336;
  GLenum draw_buffers [3];
  undefined4 uStack_31c;
  char local_318;
  undefined1 uStack_317;
  undefined6 uStack_316;
  char *local_308;
  undefined8 local_300;
  char local_2f8;
  undefined1 uStack_2f7;
  undefined6 uStack_2f6;
  char *local_2e8;
  undefined8 local_2e0;
  char local_2d8;
  undefined1 uStack_2d7;
  undefined6 uStack_2d6;
  char *local_2c8;
  undefined8 local_2c0;
  char local_2b8;
  undefined1 uStack_2b7;
  undefined6 uStack_2b6;
  char *local_2a8;
  undefined8 local_2a0;
  char local_298;
  undefined1 uStack_297;
  undefined6 uStack_296;
  char *local_288;
  undefined8 local_280;
  char local_278;
  undefined1 uStack_277;
  undefined6 uStack_276;
  char *local_268;
  undefined8 local_260;
  char local_258;
  undefined1 uStack_257;
  undefined6 uStack_256;
  char *local_248;
  undefined8 local_240;
  char local_238;
  undefined1 uStack_237;
  undefined6 uStack_236;
  char *local_228;
  undefined8 local_220;
  char local_218;
  undefined1 uStack_217;
  undefined6 uStack_216;
  char *local_208;
  undefined8 local_200;
  char local_1f8;
  undefined1 uStack_1f7;
  undefined6 uStack_1f6;
  long *local_1e8;
  long local_1d8 [2];
  GLfloat local_1c8 [2];
  DataType aDStack_1c0 [5];
  GLint isamples;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  name_index_map;
  ios_base local_138 [264];
  
  bVar2 = ShaderImageLoadStoreBase::SupportedSamples(&this->super_ShaderImageLoadStoreBase,in_ESI);
  if (!bVar2) {
    return 0x10;
  }
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  local_1c8[0] = -1.0;
  local_1c8[1] = 10.0;
  aDStack_1c0[0] = 0xc3480000;
  aDStack_1c0[1] = 0x453b8000;
  local_3f8.m_data[0] = -1.0;
  local_3f8.m_data[1] = 10.0;
  local_3f8.m_data[2] = -200.0;
  local_3f8.m_data[3] = 3000.0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  paVar15 = &local_420.first.field_2;
  local_420.first._M_string_length = 7;
  local_420.first.field_2._M_allocated_capacity = 0x66323361626772;
  local_420.first._M_dataplus._M_p = (pointer)paVar15;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&name_index_map,paVar15->_M_local_buf,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  name[0x10] = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)name._0_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"image2DMS g_image_2dms;\nlayout(",0x1f)
  ;
  local_3d8 = 7;
  local_3d0._M_allocated_capacity = 0x66323361626772;
  local_3e0 = &local_3d0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3d0._M_local_buf,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") readonly uniform ",0x13);
  draw_buffers._0_8_ = &local_318;
  stack0xfffffffffffffce0 = 0;
  local_318 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)draw_buffers._0_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
             ,0xaa);
  textures = (GLuint  [2])&local_358;
  local_358 = 0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)textures,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != ",
             0x51);
  _fbo = &local_338;
  local_340 = 0;
  local_338 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,_fbo,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != ",
             0x51);
  _uniforms = &local_380;
  local_388 = 0;
  local_380 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,_uniforms,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != ",
             0x51);
  local_248 = &local_238;
  local_240 = 0;
  local_238 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_248,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
             ,0x61);
  local_268 = &local_258;
  local_260 = 0;
  local_258 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_268,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
             ,0x61);
  local_288 = &local_278;
  local_280 = 0;
  local_278 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_288,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
             ,0x61);
  local_2a8 = &local_298;
  local_2a0 = 0;
  local_298 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2a8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
             ,0x61);
  local_2c8 = &local_2b8;
  local_2c0 = 0;
  local_2b8 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
             ,0x61);
  local_200 = 0;
  local_1f8 = '\0';
  local_208 = &local_1f8;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_1f8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
             ,0x61);
  local_220 = 0;
  local_218 = '\0';
  local_228 = &local_218;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_218,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
             ,0x61);
  local_2e8 = &local_2d8;
  local_2e0 = 0;
  local_2d8 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2e8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
             ,0x61);
  local_308 = &local_2f8;
  local_300 = 0;
  local_2f8 = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_308,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}",0x27);
  if (local_308 != &local_2f8) {
    operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT62(uStack_1f6,CONCAT11(uStack_1f7,local_1f8)) + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
  }
  if (_uniforms != &local_380) {
    operator_delete(_uniforms,CONCAT62(uStack_37e,CONCAT11(uStack_37f,local_380)) + 1);
  }
  if (_fbo != &local_338) {
    operator_delete(_fbo,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
  }
  if (textures != (GLuint  [2])&local_358) {
    operator_delete((void *)textures,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
  }
  if ((char *)draw_buffers._0_8_ != &local_318) {
    operator_delete((void *)draw_buffers._0_8_,
                    CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_420.first._M_dataplus._M_p,
                    local_420.first.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar4 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e8,(bool *)0x0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  local_370 = this;
  glu::CallLogWrapper::glGenTextures(this_00,2,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures[0]);
  glu::CallLogWrapper::glTexImage2DMultisample(this_00,0x9100,4,0x8814,0x10,0x10,'\0');
  glu::CallLogWrapper::glBindTexture(this_00,0x9100,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures[1]);
  glu::CallLogWrapper::glTexImage3DMultisample(this_00,0x9102,4,0x8814,0x10,0x10,2,'\0');
  glu::CallLogWrapper::glBindTexture(this_00,0x9102,0);
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&fbo);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0x9100,textures[0],0);
  glu::CallLogWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce1,textures[1],0,0);
  glu::CallLogWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce2,textures[1],0,1);
  draw_buffers[0] = 0x8ce0;
  draw_buffers[1] = 0x8ce1;
  stack0xfffffffffffffce0 = CONCAT44(uStack_31c,0x8ce2);
  glu::CallLogWrapper::glDrawBuffers(this_00,3,draw_buffers);
  glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,local_1c8);
  glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,1,local_1c8);
  glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,2,local_1c8);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&fbo);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[0],0,'\0',0,35000,0x8814);
  pBVar9 = local_370;
  pvVar12 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture(this_00,4,textures[1],0,'\x01',0,35000,0x8814);
  glu::CallLogWrapper::glUseProgram(this_00,GVar4);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image_2dms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,1);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image_2dms_array");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,4);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glu::CallLogWrapper::glBindVertexArray(this_00,pBVar9->m_vao);
  iVar10 = 0x10;
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar2 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&pBVar9->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,iVar10,
                     pvVar12);
  GVar11 = (GLenum)pvVar12;
  local_3bc = (undefined4)CONCAT71(extraout_var,bVar2);
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &name_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::CallLogWrapper::glGetProgramiv(this_00,GVar4,0x8b86,&uniforms);
  if (uniforms == 2) {
LAB_009b0ff4:
    GVar16 = 0;
    do {
      pcVar13 = name;
      glu::CallLogWrapper::glGetActiveUniformName(this_00,GVar4,GVar16,0x20,(GLsizei *)0x0,name);
      GVar11 = (GLenum)pcVar13;
      local_3e0 = &local_3d0;
      sVar7 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,name,name + sVar7);
      local_420.first._M_dataplus._M_p = (pointer)&local_420.first.field_2;
      if (local_3e0 == &local_3d0) {
        local_420.first.field_2._8_8_ = CONCAT71(local_3d0._9_7_,local_3d0._M_local_buf[8]);
      }
      else {
        local_420.first._M_dataplus._M_p = (pointer)local_3e0;
      }
      local_420.first.field_2._M_allocated_capacity = local_3d0._M_allocated_capacity;
      local_420.first._M_string_length = local_3d8;
      local_3d8 = 0;
      local_3d0._M_allocated_capacity = local_3d0._M_allocated_capacity & 0xffffffffffffff00;
      local_420.second = GVar16;
      local_3e0 = &local_3d0;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_420);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420.first._M_dataplus._M_p != &local_420.first.field_2) {
        operator_delete(local_420.first._M_dataplus._M_p,
                        local_420.first.field_2._M_allocated_capacity + 1);
      }
      if (local_3e0 != &local_3d0) {
        operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
      }
      GVar16 = GVar16 + 1;
      pBVar9 = local_370;
    } while (GVar16 < (uint)uniforms);
  }
  else {
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
    local_3bc = 0;
    if (uniforms != 0) goto LAB_009b0ff4;
  }
  paVar15 = &local_420.first.field_2;
  local_420.first.field_2._M_allocated_capacity = 0x5f6567616d695f67;
  local_420.first._M_string_length = 0xc;
  local_420.first.field_2._8_5_ = 0x736d6432;
  local_420.first._M_dataplus._M_p = (pointer)paVar15;
  bVar2 = ShaderImageLoadStoreBase::CheckUniform
                    (&pBVar9->super_ShaderImageLoadStoreBase,GVar4,&local_420.first,&name_index_map,
                     0x9055,GVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_420.first._M_dataplus._M_p,
                    local_420.first.field_2._M_allocated_capacity + 1);
  }
  name[0] = '\x12';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  local_420.first._M_dataplus._M_p = (pointer)paVar15;
  local_420.first._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_420,(ulong)name);
  local_420.first.field_2._M_local_buf[0] = name[0];
  local_420.first.field_2._M_local_buf[1] = name[1];
  local_420.first.field_2._M_local_buf[2] = name[2];
  local_420.first.field_2._M_local_buf[3] = name[3];
  local_420.first.field_2._M_local_buf[4] = name[4];
  local_420.first.field_2._M_local_buf[5] = name[5];
  local_420.first.field_2._M_local_buf[6] = name[6];
  local_420.first.field_2._M_local_buf[7] = name[7];
  builtin_strncpy(local_420.first._M_dataplus._M_p,"g_image_2dms_array",0x12);
  local_420.first._M_string_length._0_1_ = name[0];
  local_420.first._M_string_length._1_1_ = name[1];
  local_420.first._M_string_length._2_1_ = name[2];
  local_420.first._M_string_length._3_1_ = name[3];
  local_420.first._M_string_length._4_1_ = name[4];
  local_420.first._M_string_length._5_1_ = name[5];
  local_420.first._M_string_length._6_1_ = name[6];
  local_420.first._M_string_length._7_1_ = name[7];
  local_420.first._M_dataplus._M_p[name._0_8_] = '\0';
  bVar3 = ShaderImageLoadStoreBase::CheckUniform
                    (&pBVar9->super_ShaderImageLoadStoreBase,GVar4,&local_420.first,&name_index_map,
                     0x9056,GVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_420.first._M_dataplus._M_p,
                    local_420.first.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,2,textures);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,GVar4);
  bVar8 = (byte)local_3bc;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if ((bVar8 & bVar2 & bVar3) != 1) {
    return -1;
  }
  glu::CallLogWrapper::glGetIntegerv(this_00,0x9110,&isamples);
  if (isamples < 4) {
    return 0;
  }
  local_1c8[0] = 1.4013e-45;
  local_1c8[1] = -NAN;
  aDStack_1c0[0] = TYPE_FLOAT_VEC3;
  aDStack_1c0[1] = ~TYPE_FLOAT_VEC3;
  local_3f8.m_data[0] = 1.4013e-45;
  local_3f8.m_data[1] = -NAN;
  local_3f8.m_data[2] = 4.2039e-45;
  local_3f8.m_data[3] = -NAN;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  local_420.first._M_string_length = 7;
  local_420.first.field_2._M_allocated_capacity = 0x69323361626772;
  local_420.first._M_dataplus._M_p = (pointer)paVar15;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&name_index_map,paVar15->_M_local_buf,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[0x10] = 'i';
  name[0x11] = '\0';
  name[8] = '\x01';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)name._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"image2DMS g_image_2dms;\nlayout(",0x1f)
  ;
  local_3d8 = 7;
  local_3d0._M_allocated_capacity = 0x69323361626772;
  local_3e0 = &local_3d0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3d0._M_local_buf,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") readonly uniform ",0x13);
  draw_buffers._0_8_ = &local_318;
  local_318 = 'i';
  uStack_317 = 0;
  stack0xfffffffffffffce0 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)draw_buffers._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
             ,0xaa);
  textures = (GLuint  [2])&local_358;
  local_358 = 0x69;
  uStack_357 = 0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)textures,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != ",
             0x51);
  _fbo = &local_338;
  local_338 = 'i';
  uStack_337 = 0;
  local_340 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,_fbo,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != ",
             0x51);
  _uniforms = &local_380;
  local_380 = 'i';
  uStack_37f = 0;
  local_388 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,_uniforms,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != ",
             0x51);
  local_248 = &local_238;
  local_238 = 'i';
  uStack_237 = 0;
  local_240 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_248,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
             ,0x61);
  local_268 = &local_258;
  local_258 = 'i';
  uStack_257 = 0;
  local_260 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_268,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
             ,0x61);
  local_288 = &local_278;
  local_278 = 'i';
  uStack_277 = 0;
  local_280 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
             ,0x61);
  local_2a8 = &local_298;
  local_298 = 'i';
  uStack_297 = 0;
  local_2a0 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
             ,0x61);
  local_2c8 = &local_2b8;
  local_2b8 = 'i';
  uStack_2b7 = 0;
  local_2c0 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
             ,0x61);
  local_208 = &local_1f8;
  local_1f8 = 'i';
  uStack_1f7 = 0;
  local_200 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_208,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
             ,0x61);
  local_228 = &local_218;
  local_218 = 'i';
  uStack_217 = 0;
  local_220 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_228,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
             ,0x61);
  local_2e8 = &local_2d8;
  local_2d8 = 'i';
  uStack_2d7 = 0;
  local_2e0 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2e8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
             ,0x61);
  local_308 = &local_2f8;
  local_2f8 = 'i';
  uStack_2f7 = 0;
  local_300 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_308,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}",0x27);
  if (local_308 != &local_2f8) {
    operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT62(uStack_1f6,CONCAT11(uStack_1f7,local_1f8)) + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
  }
  if (_uniforms != &local_380) {
    operator_delete(_uniforms,CONCAT62(uStack_37e,CONCAT11(uStack_37f,local_380)) + 1);
  }
  if (_fbo != &local_338) {
    operator_delete(_fbo,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
  }
  if (textures != (GLuint  [2])&local_358) {
    operator_delete((void *)textures,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
  }
  if ((char *)draw_buffers._0_8_ != &local_318) {
    operator_delete((void *)draw_buffers._0_8_,
                    CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_420.first._M_dataplus._M_p,
                    local_420.first.field_2._M_allocated_capacity + 1);
  }
  p_Var1 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar4 = ShaderImageLoadStoreBase::BuildProgram
                    (&pBVar9->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e8,(bool *)0x0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  glu::CallLogWrapper::glGenTextures(this_00,2,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures[0]);
  glu::CallLogWrapper::glTexImage2DMultisample(this_00,0x9100,4,0x8d82,0x10,0x10,'\0');
  glu::CallLogWrapper::glBindTexture(this_00,0x9100,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures[1]);
  glu::CallLogWrapper::glTexImage3DMultisample(this_00,0x9102,4,0x8d82,0x10,0x10,2,'\0');
  glu::CallLogWrapper::glBindTexture(this_00,0x9102,0);
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&fbo);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0x9100,textures[0],0);
  glu::CallLogWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce1,textures[1],0,0);
  glu::CallLogWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce2,textures[1],0,1);
  draw_buffers[0] = 0x8ce0;
  draw_buffers[1] = 0x8ce1;
  stack0xfffffffffffffce0 = CONCAT44(uStack_31c,0x8ce2);
  glu::CallLogWrapper::glDrawBuffers(this_00,3,draw_buffers);
  glu::CallLogWrapper::glClearBufferiv(this_00,0x1800,0,(GLint *)local_1c8);
  glu::CallLogWrapper::glClearBufferiv(this_00,0x1800,1,(GLint *)local_1c8);
  glu::CallLogWrapper::glClearBufferiv(this_00,0x1800,2,(GLint *)local_1c8);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&fbo);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[0],0,'\0',0,35000,0x8d82);
  pvVar12 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture(this_00,4,textures[1],0,'\x01',0,35000,0x8d82);
  glu::CallLogWrapper::glUseProgram(this_00,GVar4);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image_2dms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,1);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image_2dms_array");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,4);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  pBVar9 = local_370;
  glu::CallLogWrapper::glBindVertexArray(this_00,local_370->m_vao);
  iVar10 = 0x10;
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar2 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&pBVar9->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,iVar10,
                     pvVar12);
  GVar11 = (GLenum)pvVar12;
  uVar14 = (undefined4)CONCAT71(extraout_var_00,bVar2);
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  glu::CallLogWrapper::glGetProgramiv(this_00,GVar4,0x8b86,&uniforms);
  if (uniforms == 2) {
LAB_009b1ef9:
    GVar16 = 0;
    local_3bc = uVar14;
    do {
      pcVar13 = name;
      glu::CallLogWrapper::glGetActiveUniformName(this_00,GVar4,GVar16,0x20,(GLsizei *)0x0,name);
      GVar11 = (GLenum)pcVar13;
      local_3e0 = &local_3d0;
      sVar7 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,name,name + sVar7);
      local_420.first._M_dataplus._M_p = (pointer)&local_420.first.field_2;
      if (local_3e0 == &local_3d0) {
        local_420.first.field_2._8_8_ = CONCAT71(local_3d0._9_7_,local_3d0._M_local_buf[8]);
      }
      else {
        local_420.first._M_dataplus._M_p = (pointer)local_3e0;
      }
      local_420.first.field_2._M_allocated_capacity = local_3d0._M_allocated_capacity;
      local_420.first._M_string_length = local_3d8;
      local_3d8 = 0;
      local_3d0._M_allocated_capacity = local_3d0._M_allocated_capacity & 0xffffffffffffff00;
      local_420.second = GVar16;
      local_3e0 = &local_3d0;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_420);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420.first._M_dataplus._M_p != &local_420.first.field_2) {
        operator_delete(local_420.first._M_dataplus._M_p,
                        local_420.first.field_2._M_allocated_capacity + 1);
      }
      if (local_3e0 != &local_3d0) {
        operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
      }
      GVar16 = GVar16 + 1;
      uVar14 = local_3bc;
    } while (GVar16 < (uint)uniforms);
  }
  else {
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
    uVar14 = 0;
    if (uniforms != 0) goto LAB_009b1ef9;
  }
  paVar15 = &local_420.first.field_2;
  local_420.first.field_2._M_allocated_capacity = 0x5f6567616d695f67;
  local_420.first._M_string_length = 0xc;
  local_420.first.field_2._8_5_ = 0x736d6432;
  local_420.first._M_dataplus._M_p = (pointer)paVar15;
  bVar2 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_370->super_ShaderImageLoadStoreBase,GVar4,&local_420.first,
                     &name_index_map,0x9060,GVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_420.first._M_dataplus._M_p,
                    local_420.first.field_2._M_allocated_capacity + 1);
  }
  name[0] = '\x12';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  local_420.first._M_dataplus._M_p = (pointer)paVar15;
  local_420.first._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_420,(ulong)name);
  local_420.first.field_2._M_local_buf[0] = name[0];
  local_420.first.field_2._M_local_buf[1] = name[1];
  local_420.first.field_2._M_local_buf[2] = name[2];
  local_420.first.field_2._M_local_buf[3] = name[3];
  local_420.first.field_2._M_local_buf[4] = name[4];
  local_420.first.field_2._M_local_buf[5] = name[5];
  local_420.first.field_2._M_local_buf[6] = name[6];
  local_420.first.field_2._M_local_buf[7] = name[7];
  builtin_strncpy(local_420.first._M_dataplus._M_p,"g_image_2dms_array",0x12);
  local_420.first._M_string_length._0_1_ = name[0];
  local_420.first._M_string_length._1_1_ = name[1];
  local_420.first._M_string_length._2_1_ = name[2];
  local_420.first._M_string_length._3_1_ = name[3];
  local_420.first._M_string_length._4_1_ = name[4];
  local_420.first._M_string_length._5_1_ = name[5];
  local_420.first._M_string_length._6_1_ = name[6];
  local_420.first._M_string_length._7_1_ = name[7];
  local_420.first._M_dataplus._M_p[name._0_8_] = '\0';
  bVar3 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_370->super_ShaderImageLoadStoreBase,GVar4,&local_420.first,
                     &name_index_map,0x9061,GVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_420.first._M_dataplus._M_p,
                    local_420.first.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,2,textures);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,GVar4);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if (((byte)uVar14 & bVar2 & bVar3) != 1) {
    return -1;
  }
  local_1c8[0] = 1.4013e-45;
  local_1c8[1] = 2.8026e-45;
  aDStack_1c0[0] = TYPE_FLOAT_VEC3;
  aDStack_1c0[1] = TYPE_FLOAT_VEC4;
  local_3f8.m_data[0] = 1.4013e-45;
  local_3f8.m_data[1] = 2.8026e-45;
  local_3f8.m_data[2] = 4.2039e-45;
  local_3f8.m_data[3] = 5.60519e-45;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  local_420.first.field_2._M_allocated_capacity = 0x6975323361626772;
  local_420.first._M_string_length = 8;
  local_420.first.field_2._8_8_ = local_420.first.field_2._8_8_ & 0xffffffffffffff00;
  local_420.first._M_dataplus._M_p = (pointer)paVar15;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&name_index_map,paVar15->_M_local_buf,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[0x10] = 'u';
  name[0x11] = '\0';
  name[8] = '\x01';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)name._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"image2DMS g_image_2dms;\nlayout(",0x1f)
  ;
  local_3d0._M_allocated_capacity = 0x6975323361626772;
  local_3d8 = 8;
  local_3d0._M_local_buf[8] = '\0';
  local_3e0 = &local_3d0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3d0._M_local_buf,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") readonly uniform ",0x13);
  draw_buffers._0_8_ = &local_318;
  local_318 = 'u';
  uStack_317 = 0;
  stack0xfffffffffffffce0 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)draw_buffers._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
             ,0xaa);
  textures = (GLuint  [2])&local_358;
  local_358 = 0x75;
  uStack_357 = 0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)textures,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != ",
             0x51);
  _fbo = &local_338;
  local_338 = 'u';
  uStack_337 = 0;
  local_340 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,_fbo,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != ",
             0x51);
  _uniforms = &local_380;
  local_380 = 'u';
  uStack_37f = 0;
  local_388 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,_uniforms,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != ",
             0x51);
  local_248 = &local_238;
  local_238 = 'u';
  uStack_237 = 0;
  local_240 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_248,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
             ,0x61);
  local_268 = &local_258;
  local_258 = 'u';
  uStack_257 = 0;
  local_260 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_268,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
             ,0x61);
  local_288 = &local_278;
  local_278 = 'u';
  uStack_277 = 0;
  local_280 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
             ,0x61);
  local_2a8 = &local_298;
  local_298 = 'u';
  uStack_297 = 0;
  local_2a0 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
             ,0x61);
  local_2c8 = &local_2b8;
  local_2b8 = 'u';
  uStack_2b7 = 0;
  local_2c0 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
             ,0x61);
  local_208 = &local_1f8;
  local_1f8 = 'u';
  uStack_1f7 = 0;
  local_200 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_208,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
             ,0x61);
  local_228 = &local_218;
  local_218 = 'u';
  uStack_217 = 0;
  local_220 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_228,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
             ,0x61);
  local_2e8 = &local_2d8;
  local_2d8 = 'u';
  uStack_2d7 = 0;
  local_2e0 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2e8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
             ,0x61);
  local_308 = &local_2f8;
  local_2f8 = 'u';
  uStack_2f7 = 0;
  local_300 = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_308,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,(Vector<unsigned_int,_4> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}",0x27);
  if (local_308 != &local_2f8) {
    operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT62(uStack_1f6,CONCAT11(uStack_1f7,local_1f8)) + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
  }
  if (_uniforms != &local_380) {
    operator_delete(_uniforms,CONCAT62(uStack_37e,CONCAT11(uStack_37f,local_380)) + 1);
  }
  if (_fbo != &local_338) {
    operator_delete(_fbo,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
  }
  if (textures != (GLuint  [2])&local_358) {
    operator_delete((void *)textures,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
  }
  if ((char *)draw_buffers._0_8_ != &local_318) {
    operator_delete((void *)draw_buffers._0_8_,
                    CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_420.first._M_dataplus._M_p,
                    local_420.first.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar4 = ShaderImageLoadStoreBase::BuildProgram
                    (&local_370->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e8,(bool *)0x0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  glu::CallLogWrapper::glGenTextures(this_00,2,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures[0]);
  glu::CallLogWrapper::glTexImage2DMultisample(this_00,0x9100,4,0x8d70,0x10,0x10,'\0');
  glu::CallLogWrapper::glBindTexture(this_00,0x9100,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures[1]);
  glu::CallLogWrapper::glTexImage3DMultisample(this_00,0x9102,4,0x8d70,0x10,0x10,2,'\0');
  glu::CallLogWrapper::glBindTexture(this_00,0x9102,0);
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&fbo);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0x9100,textures[0],0);
  glu::CallLogWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce1,textures[1],0,0);
  glu::CallLogWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce2,textures[1],0,1);
  draw_buffers[0] = 0x8ce0;
  draw_buffers[1] = 0x8ce1;
  stack0xfffffffffffffce0 = CONCAT44(uStack_31c,0x8ce2);
  glu::CallLogWrapper::glDrawBuffers(this_00,3,draw_buffers);
  glu::CallLogWrapper::glClearBufferuiv(this_00,0x1800,0,(GLuint *)local_1c8);
  glu::CallLogWrapper::glClearBufferuiv(this_00,0x1800,1,(GLuint *)local_1c8);
  glu::CallLogWrapper::glClearBufferuiv(this_00,0x1800,2,(GLuint *)local_1c8);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&fbo);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[0],0,'\0',0,35000,0x8d70);
  pvVar12 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture(this_00,4,textures[1],0,'\x01',0,35000,0x8d70);
  glu::CallLogWrapper::glUseProgram(this_00,GVar4);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image_2dms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,1);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image_2dms_array");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,4);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  pBVar9 = local_370;
  glu::CallLogWrapper::glBindVertexArray(this_00,local_370->m_vao);
  iVar10 = 0x10;
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar2 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&pBVar9->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,iVar10,
                     pvVar12);
  GVar11 = (GLenum)pvVar12;
  local_3bc = (undefined4)CONCAT71(extraout_var_01,bVar2);
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &name_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::CallLogWrapper::glGetProgramiv(this_00,GVar4,0x8b86,&uniforms);
  if (uniforms != 2) {
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
    local_3bc = 0;
    if (uniforms == 0) goto LAB_009b2ef8;
  }
  GVar16 = 0;
  do {
    pcVar13 = name;
    glu::CallLogWrapper::glGetActiveUniformName(this_00,GVar4,GVar16,0x20,(GLsizei *)0x0,name);
    GVar11 = (GLenum)pcVar13;
    local_3e0 = &local_3d0;
    sVar7 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,name,name + sVar7);
    local_420.first._M_dataplus._M_p = (pointer)&local_420.first.field_2;
    if (local_3e0 == &local_3d0) {
      local_420.first.field_2._8_8_ = CONCAT71(local_3d0._9_7_,local_3d0._M_local_buf[8]);
    }
    else {
      local_420.first._M_dataplus._M_p = (pointer)local_3e0;
    }
    local_420.first.field_2._M_allocated_capacity = local_3d0._M_allocated_capacity;
    local_420.first._M_string_length = local_3d8;
    local_3d8 = 0;
    local_3d0._M_allocated_capacity = local_3d0._M_allocated_capacity & 0xffffffffffffff00;
    local_420.second = GVar16;
    local_3e0 = &local_3d0;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                *)&name_index_map,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420.first._M_dataplus._M_p != &local_420.first.field_2) {
      operator_delete(local_420.first._M_dataplus._M_p,
                      local_420.first.field_2._M_allocated_capacity + 1);
    }
    if (local_3e0 != &local_3d0) {
      operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
    }
    GVar16 = GVar16 + 1;
    pBVar9 = local_370;
  } while (GVar16 < (uint)uniforms);
LAB_009b2ef8:
  paVar15 = &local_420.first.field_2;
  local_420.first.field_2._M_allocated_capacity = 0x5f6567616d695f67;
  local_420.first._M_string_length = 0xc;
  local_420.first.field_2._8_5_ = 0x736d6432;
  local_420.first._M_dataplus._M_p = (pointer)paVar15;
  bVar2 = ShaderImageLoadStoreBase::CheckUniform
                    (&pBVar9->super_ShaderImageLoadStoreBase,GVar4,&local_420.first,&name_index_map,
                     0x906b,GVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_420.first._M_dataplus._M_p,
                    local_420.first.field_2._M_allocated_capacity + 1);
  }
  name[0] = '\x12';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  local_420.first._M_dataplus._M_p = (pointer)paVar15;
  local_420.first._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_420,(ulong)name);
  local_420.first.field_2._M_local_buf[0] = name[0];
  local_420.first.field_2._M_local_buf[1] = name[1];
  local_420.first.field_2._M_local_buf[2] = name[2];
  local_420.first.field_2._M_local_buf[3] = name[3];
  local_420.first.field_2._M_local_buf[4] = name[4];
  local_420.first.field_2._M_local_buf[5] = name[5];
  local_420.first.field_2._M_local_buf[6] = name[6];
  local_420.first.field_2._M_local_buf[7] = name[7];
  builtin_strncpy(local_420.first._M_dataplus._M_p,"g_image_2dms_array",0x12);
  local_420.first._M_string_length._0_1_ = name[0];
  local_420.first._M_string_length._1_1_ = name[1];
  local_420.first._M_string_length._2_1_ = name[2];
  local_420.first._M_string_length._3_1_ = name[3];
  local_420.first._M_string_length._4_1_ = name[4];
  local_420.first._M_string_length._5_1_ = name[5];
  local_420.first._M_string_length._6_1_ = name[6];
  local_420.first._M_string_length._7_1_ = name[7];
  local_420.first._M_dataplus._M_p[name._0_8_] = '\0';
  bVar3 = ShaderImageLoadStoreBase::CheckUniform
                    (&pBVar9->super_ShaderImageLoadStoreBase,GVar4,&local_420.first,&name_index_map,
                     0x906c,GVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_420.first._M_dataplus._M_p,
                    local_420.first.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,2,textures);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,GVar4);
  bVar8 = (byte)local_3bc;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if ((bVar8 & bVar2 & bVar3) == 1) {
    return 0;
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		if (!SupportedSamples(4))
			return NOT_SUPPORTED;

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!ReadMS(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;

		GLint isamples;
		glGetIntegerv(GL_MAX_INTEGER_SAMPLES, &isamples);
		if (isamples >= 4)
		{
			if (!ReadMS(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
				return ERROR;
			if (!ReadMS(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
				return ERROR;
		}

		return NO_ERROR;
	}